

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubsetTests.cpp
# Opt level: O3

void __thiscall
IsIterableContainingSubsetTests::~IsIterableContainingSubsetTests
          (IsIterableContainingSubsetTests *this)

{
  ut11::TestFixture::~TestFixture(&this->super_TestFixture);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run()
	{
		Then("a vector containing the passed subset is true", []() {
			AssertThat(ut11::Is::Iterable::Containing::Subset(std::vector<int>({4,2}))(std::vector<int>({1,2,3,4,5})), ut11::Is::True);
		});

		Then("a vector containing an equivalent set of the passed set is true", []() {
			AssertThat(ut11::Is::Iterable::Containing::Subset(std::vector<int>({1,2,3,4,5}))(std::vector<int>({1,2,3,4,5})), ut11::Is::True);
		});

		Then("a vector containing a subset of the passed set is false", []() {
			AssertThat(ut11::Is::Iterable::Containing::Subset(std::vector<int>({1,2,3,4,5,6}))(std::vector<int>({1,2,3,4,5})), ut11::Is::False);
		});

		Then("a vector not containing the passed subset is false", []() {
			AssertThat(ut11::Is::Iterable::Containing::Subset(std::vector<int>({4,8}))(std::vector<int>({1,2,3,4,5})), ut11::Is::False);
		});

		Then("Is::Iterable::Containing::Subset() is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Iterable::Containing::Subset(5)) >::value, ut11::Is::True);
		});

		Then("Is::Iterable::Containing::Subset() has an error message", []() {
			AssertThat(ut11::Is::Iterable::Containing::Subset(5).GetErrorMessage(std::vector<int>()), ut11::Is::Not::EqualTo(""));
		});
	}